

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

bool __thiscall
testing::internal::DefaultDeathTestFactory::Create
          (DefaultDeathTestFactory *this,char *statement,
          Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *matcher,char *file,int line,DeathTest **test)

{
  size_type *psVar1;
  InternalRunDeathTestFlag *pIVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  ExecDeathTest *this_00;
  undefined8 *puVar6;
  NoExecDeathTest *this_01;
  long *plVar7;
  ulong *puVar8;
  ulong uVar9;
  undefined8 uVar10;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *this_02;
  int death_test_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  long *local_118;
  long local_110;
  long local_108;
  long lStack_100;
  int local_f4;
  char *local_f0;
  ulong *local_e8;
  long local_e0;
  ulong local_d8;
  long lStack_d0;
  string local_c8;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  int local_84;
  string local_80;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_60;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_48;
  
  local_f0 = statement;
  UnitTest::GetInstance();
  pIVar2 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_)._M_t.
           super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl
  ;
  iVar3 = ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).death_test_count_;
  iVar4 = iVar3 + 1;
  ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).death_test_count_ = iVar4;
  local_f4 = iVar4;
  if (pIVar2 != (InternalRunDeathTestFlag *)0x0) {
    if (pIVar2->index_ <= iVar3) {
      StreamableToString<int>(&local_80,&local_f4);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,0x4991b4);
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_98 = *plVar7;
        lStack_90 = plVar5[3];
        local_a8 = &local_98;
      }
      else {
        local_98 = *plVar7;
        local_a8 = (long *)*plVar5;
      }
      local_a0 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_a8);
      puVar8 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar8) {
        local_d8 = *puVar8;
        lStack_d0 = plVar5[3];
        local_e8 = &local_d8;
      }
      else {
        local_d8 = *puVar8;
        local_e8 = (ulong *)*plVar5;
      }
      local_e0 = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_84 = pIVar2->index_;
      StreamableToString<int>(&local_c8,&local_84);
      uVar9 = 0xf;
      if (local_e8 != &local_d8) {
        uVar9 = local_d8;
      }
      if (uVar9 < local_c8._M_string_length + local_e0) {
        uVar10 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          uVar10 = local_c8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar10 < local_c8._M_string_length + local_e0) goto LAB_0033a662;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_e8);
      }
      else {
LAB_0033a662:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_c8._M_dataplus._M_p)
        ;
      }
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      psVar1 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar1) {
        local_138.field_2._M_allocated_capacity = *psVar1;
        local_138.field_2._8_8_ = puVar6[3];
      }
      else {
        local_138.field_2._M_allocated_capacity = *psVar1;
        local_138._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_138._M_string_length = puVar6[1];
      *puVar6 = psVar1;
      puVar6[1] = 0;
      *(undefined1 *)psVar1 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_138);
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_108 = *plVar7;
        lStack_100 = plVar5[3];
        local_118 = &local_108;
      }
      else {
        local_108 = *plVar7;
        local_118 = (long *)*plVar5;
      }
      local_110 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
      if (local_118 != &local_108) {
        operator_delete(local_118,local_108 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,local_d8 + 1);
      }
      if (local_a8 != &local_98) {
        operator_delete(local_a8,local_98 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p == &local_80.field_2) {
        return false;
      }
      goto LAB_0033a880;
    }
    iVar3 = std::__cxx11::string::compare((char *)pIVar2);
    if (((iVar3 != 0) || (pIVar2->line_ != line)) || (pIVar2->index_ != iVar4)) {
      *test = (DeathTest *)0x0;
      return true;
    }
  }
  iVar4 = std::__cxx11::string::compare((char *)&FLAGS_gtest_death_test_style_abi_cxx11_);
  if (iVar4 == 0) {
    this_00 = (ExecDeathTest *)operator_new(0x50);
    local_48.vtable_ =
         (matcher->
         super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
         ).vtable_;
    local_48.buffer_ =
         (matcher->
         super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
         ).buffer_;
    (matcher->
    super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ).vtable_ = (VTable *)0x0;
    local_48.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
         (_func_int **)&PTR__MatcherBase_0056c728;
    ExecDeathTest::ExecDeathTest
              (this_00,local_f0,
               (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_48,file,line);
    *test = (DeathTest *)this_00;
    this_02 = &local_48;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)&FLAGS_gtest_death_test_style_abi_cxx11_);
    if (iVar4 != 0) {
      std::operator+(&local_138,"Unknown death test style \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &FLAGS_gtest_death_test_style_abi_cxx11_);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_138);
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_108 = *plVar7;
        lStack_100 = plVar5[3];
        local_118 = &local_108;
      }
      else {
        local_108 = *plVar7;
        local_118 = (long *)*plVar5;
      }
      local_110 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
      if (local_118 != &local_108) {
        operator_delete(local_118,local_108 + 1);
      }
      local_80.field_2._M_allocated_capacity = local_138.field_2._M_allocated_capacity;
      local_80._M_dataplus._M_p = local_138._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p == &local_138.field_2) {
        return false;
      }
LAB_0033a880:
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      return false;
    }
    this_01 = (NoExecDeathTest *)operator_new(0x40);
    local_60.vtable_ =
         (matcher->
         super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
         ).vtable_;
    local_60.buffer_ =
         (matcher->
         super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
         ).buffer_;
    (matcher->
    super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ).vtable_ = (VTable *)0x0;
    local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
         (_func_int **)&PTR__MatcherBase_0056c728;
    NoExecDeathTest::NoExecDeathTest
              (this_01,local_f0,
               (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_60);
    *test = (DeathTest *)this_01;
    this_02 = &local_60;
  }
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase(this_02);
  return true;
}

Assistant:

bool DefaultDeathTestFactory::Create(const char* statement,
                                     Matcher<const std::string&> matcher,
                                     const char* file, int line,
                                     DeathTest** test) {
  UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const int death_test_index =
      impl->current_test_info()->increment_death_test_count();

  if (flag != nullptr) {
    if (death_test_index > flag->index()) {
      DeathTest::set_last_death_test_message(
          "Death test count (" + StreamableToString(death_test_index) +
          ") somehow exceeded expected maximum (" +
          StreamableToString(flag->index()) + ")");
      return false;
    }

    if (!(flag->file() == file && flag->line() == line &&
          flag->index() == death_test_index)) {
      *test = nullptr;
      return true;
    }
  }

#ifdef GTEST_OS_WINDOWS

  if (GTEST_FLAG_GET(death_test_style) == "threadsafe" ||
      GTEST_FLAG_GET(death_test_style) == "fast") {
    *test = new WindowsDeathTest(statement, std::move(matcher), file, line);
  }

#elif defined(GTEST_OS_FUCHSIA)

  if (GTEST_FLAG_GET(death_test_style) == "threadsafe" ||
      GTEST_FLAG_GET(death_test_style) == "fast") {
    *test = new FuchsiaDeathTest(statement, std::move(matcher), file, line);
  }

#else

  if (GTEST_FLAG_GET(death_test_style) == "threadsafe") {
    *test = new ExecDeathTest(statement, std::move(matcher), file, line);
  } else if (GTEST_FLAG_GET(death_test_style) == "fast") {
    *test = new NoExecDeathTest(statement, std::move(matcher));
  }

#endif  // GTEST_OS_WINDOWS

  else {  // NOLINT - this is more readable than unbalanced brackets inside #if.
    DeathTest::set_last_death_test_message("Unknown death test style \"" +
                                           GTEST_FLAG_GET(death_test_style) +
                                           "\" encountered");
    return false;
  }